

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

bool leveldb::ParseInternalKey(Slice *internal_key,ParsedInternalKey *result)

{
  char *pcVar1;
  Slice local_48;
  byte local_31;
  uint64_t uStack_30;
  uint8_t c;
  uint64_t num;
  size_t n;
  ParsedInternalKey *result_local;
  Slice *internal_key_local;
  
  n = (size_t)result;
  result_local = (ParsedInternalKey *)internal_key;
  num = Slice::size(internal_key);
  if (num < 8) {
    internal_key_local._7_1_ = false;
  }
  else {
    pcVar1 = Slice::data(&result_local->user_key);
    uStack_30 = DecodeFixed64(pcVar1 + (num - 8));
    local_31 = (byte)uStack_30;
    *(uint64_t *)(n + 0x10) = uStack_30 >> 8;
    *(uint *)(n + 0x18) = (uint)local_31;
    pcVar1 = Slice::data(&result_local->user_key);
    Slice::Slice(&local_48,pcVar1,num - 8);
    *(char **)n = local_48.data_;
    *(size_t *)(n + 8) = local_48.size_;
    internal_key_local._7_1_ = local_31 < 2;
  }
  return internal_key_local._7_1_;
}

Assistant:

inline bool ParseInternalKey(const Slice& internal_key,
                             ParsedInternalKey* result) {
  const size_t n = internal_key.size();
  if (n < 8) return false;
  uint64_t num = DecodeFixed64(internal_key.data() + n - 8);
  uint8_t c = num & 0xff;
  result->sequence = num >> 8;
  result->type = static_cast<ValueType>(c);
  result->user_key = Slice(internal_key.data(), n - 8);
  return (c <= static_cast<uint8_t>(kTypeValue));
}